

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_kernel_timer.cpp
# Opt level: O0

void KokkosTools::KernelTimer::kokkosp_finalize_library(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *__s;
  FILE *__stream;
  pointer ppVar6;
  iterator __first;
  iterator __last;
  size_type sVar7;
  reference ppVar8;
  type *ppKVar9;
  char *pcVar10;
  double dVar11;
  char local_208 [8];
  char currentwd [256];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>
  *kernel_1;
  iterator __end3_1;
  iterator __begin3_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
  *__range3_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>
  *kernel;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
  *__range3;
  bool print_comma;
  double percentKokkos;
  _Self local_88;
  _Self local_80;
  iterator kernel_itr_1;
  vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
  kernelList;
  _Self local_58;
  _Self local_50;
  iterator kernel_itr;
  double totalExecuteTime;
  FILE *output_data;
  char *fileOutput;
  char *hostname;
  double kernelTimes;
  bool kokkos_tools_timer_json;
  char *kokkos_tools_timer_json_raw;
  double finishTime;
  
  dVar11 = seconds();
  pcVar5 = getenv("KOKKOS_TOOLS_TIMER_JSON");
  if (pcVar5 == (char *)0x0) {
    bVar1 = false;
  }
  else {
    iVar3 = strcmp(pcVar5,"1");
    bVar1 = true;
    if (iVar3 != 0) {
      iVar3 = strcmp(pcVar5,"true");
      bVar1 = true;
      if (iVar3 != 0) {
        iVar3 = strcmp(pcVar5,"True");
        bVar1 = iVar3 == 0;
      }
    }
  }
  hostname = (char *)0x0;
  pcVar5 = (char *)malloc(0x100);
  gethostname(pcVar5,0x100);
  __s = (char *)malloc(0x100);
  uVar4 = getpid();
  pcVar10 = "dat";
  if (bVar1) {
    pcVar10 = "json";
  }
  snprintf(__s,0x100,"%s-%d.%s",pcVar5,(ulong)uVar4,pcVar10);
  free(pcVar5);
  __stream = fopen(__s,"wb");
  kernel_itr._M_node = (_Base_ptr)(dVar11 - initTime);
  if (bVar1) {
    std::
    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
    ::vector((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
              *)&kernel_itr_1);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                  *)count_map_abi_cxx11_);
    while( true ) {
      local_88._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                  *)count_map_abi_cxx11_);
      bVar1 = std::operator!=(&local_80,&local_88);
      if (!bVar1) break;
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
               ::operator->(&local_80);
      std::
      vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ::push_back((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                   *)&kernel_itr_1,&ppVar6->second);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
               ::operator->(&local_80);
      dVar11 = KernelPerformanceInfo::getTime(ppVar6->second);
      hostname = (char *)(dVar11 + (double)hostname);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ::operator++(&local_80,0);
    }
    __first = std::
              vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
              ::begin((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                       *)&kernel_itr_1);
    __last = std::
             vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
             ::end((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    *)&kernel_itr_1);
    std::
    sort<__gnu_cxx::__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo**,std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>>,bool(*)(KokkosTools::KernelTimer::KernelPerformanceInfo*,KokkosTools::KernelTimer::KernelPerformanceInfo*)>
              ((__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                )__first._M_current,
               (__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                )__last._M_current,compareKernelPerformanceInfo);
    fprintf(__stream,"{\n\"kokkos-kernel-data\" : {\n");
    fprintf(__stream,"    \"total-app-time\"         : %10.3f,\n",kernel_itr._M_node);
    fprintf(__stream,"    \"total-kernel-times\"     : %10.3f,\n",hostname);
    fprintf(__stream,"    \"total-non-kernel-times\" : %10.3f,\n",
            (double)kernel_itr._M_node - (double)hostname);
    fprintf(__stream,"    \"percent-in-kernels\"     : %6.2f,\n",
            ((double)hostname / (double)kernel_itr._M_node) * 100.0);
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                    *)count_map_abi_cxx11_);
    fprintf(__stream,"    \"unique-kernel-calls\"    : %22llu,\n",sVar7);
    fprintf(__stream,"\n");
    fprintf(__stream,"    \"region-perf-info\"       : [\n");
    bVar1 = false;
    __end3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                      *)count_map_abi_cxx11_);
    kernel = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                       *)count_map_abi_cxx11_);
    while (bVar2 = std::operator!=(&__end3,(_Self *)&kernel), bVar2) {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
               ::operator*(&__end3);
      ppKVar9 = std::
                get<1ul,std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>
                          (ppVar8);
      bVar2 = is_region(*ppKVar9);
      if (bVar2) {
        if (bVar1) {
          fprintf(__stream,",\n");
        }
        KernelPerformanceInfo::writeToJSONFile(ppVar8->second,(FILE *)__stream,"       ");
        bVar1 = true;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ::operator++(&__end3);
    }
    fprintf(__stream,"\n");
    fprintf(__stream,"    ],\n");
    fprintf(__stream,"    \"kernel-perf-info\"       : [\n");
    bVar1 = false;
    __end3_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                        *)count_map_abi_cxx11_);
    kernel_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                         *)count_map_abi_cxx11_);
    while (bVar2 = std::operator!=(&__end3_1,(_Self *)&kernel_1), bVar2) {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
               ::operator*(&__end3_1);
      ppKVar9 = std::
                get<1ul,std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>
                          (ppVar8);
      bVar2 = is_region(*ppKVar9);
      if (!bVar2) {
        if (bVar1) {
          fprintf(__stream,",\n");
        }
        KernelPerformanceInfo::writeToJSONFile(ppVar8->second,(FILE *)__stream,"       ");
        bVar1 = true;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ::operator++(&__end3_1);
    }
    fprintf(__stream,"\n");
    fprintf(__stream,"    ]\n");
    fprintf(__stream,"}\n}");
    std::
    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
    ::~vector((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
               *)&kernel_itr_1);
  }
  else {
    fwrite(&kernel_itr,8,1,__stream);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                  *)count_map_abi_cxx11_);
    while( true ) {
      local_58._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                  *)count_map_abi_cxx11_);
      bVar1 = std::operator!=(&local_50,&local_58);
      if (!bVar1) break;
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
               ::operator->(&local_50);
      KernelPerformanceInfo::writeToBinaryFile(ppVar6->second,(FILE *)__stream);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ::operator++(&local_50,0);
    }
  }
  fclose(__stream);
  getcwd(local_208,0x100);
  printf("KokkosP: Kernel timing written to %s/%s \n",local_208,__s);
  return;
}

Assistant:

void kokkosp_finalize_library() {
  double finishTime = seconds();

  const char* kokkos_tools_timer_json_raw = getenv("KOKKOS_TOOLS_TIMER_JSON");
  const bool kokkos_tools_timer_json =
      kokkos_tools_timer_json_raw == NULL
          ? false
          : strcmp(kokkos_tools_timer_json_raw, "1") == 0 ||
                strcmp(kokkos_tools_timer_json_raw, "true") == 0 ||
                strcmp(kokkos_tools_timer_json_raw, "True") == 0;

  double kernelTimes = 0;

  char* hostname = (char*)malloc(sizeof(char) * 256);
  gethostname(hostname, 256);

  char* fileOutput = (char*)malloc(sizeof(char) * 256);
  snprintf(fileOutput, 256, "%s-%d.%s", hostname, (int)getpid(),
           kokkos_tools_timer_json ? "json" : "dat");

  free(hostname);
  FILE* output_data = fopen(fileOutput, "wb");

  const double totalExecuteTime = (finishTime - initTime);
  if (!kokkos_tools_timer_json) {
    fwrite(&totalExecuteTime, sizeof(totalExecuteTime), 1, output_data);

    for (auto kernel_itr = count_map.begin(); kernel_itr != count_map.end();
         kernel_itr++) {
      kernel_itr->second->writeToBinaryFile(output_data);
    }
  } else {
    std::vector<KernelPerformanceInfo*> kernelList;

    for (auto kernel_itr = count_map.begin(); kernel_itr != count_map.end();
         kernel_itr++) {
      kernelList.push_back(kernel_itr->second);
      kernelTimes += kernel_itr->second->getTime();
    }

    std::sort(kernelList.begin(), kernelList.end(),
              compareKernelPerformanceInfo);

    fprintf(output_data, "{\n\"kokkos-kernel-data\" : {\n");
    fprintf(output_data, "    \"total-app-time\"         : %10.3f,\n",
            totalExecuteTime);
    fprintf(output_data, "    \"total-kernel-times\"     : %10.3f,\n",
            kernelTimes);
    fprintf(output_data, "    \"total-non-kernel-times\" : %10.3f,\n",
            (totalExecuteTime - kernelTimes));

    const double percentKokkos = (kernelTimes / totalExecuteTime) * 100.0;
    fprintf(output_data, "    \"percent-in-kernels\"     : %6.2f,\n",
            percentKokkos);
    fprintf(output_data, "    \"unique-kernel-calls\"    : %22llu,\n",
            (unsigned long long)count_map.size());
    fprintf(output_data, "\n");

    fprintf(output_data, "    \"region-perf-info\"       : [\n");

#define KERNEL_INFO_INDENT "       "

    bool print_comma = false;
    for (auto const& kernel : count_map) {
      if (!is_region(*std::get<1>(kernel))) continue;
      if (print_comma) fprintf(output_data, ",\n");
      kernel.second->writeToJSONFile(output_data, KERNEL_INFO_INDENT);
      print_comma = true;
    }

    fprintf(output_data, "\n");
    fprintf(output_data, "    ],\n");

    fprintf(output_data, "    \"kernel-perf-info\"       : [\n");

    print_comma = false;
    for (auto const& kernel : count_map) {
      if (is_region(*std::get<1>(kernel))) continue;
      if (print_comma) fprintf(output_data, ",\n");
      kernel.second->writeToJSONFile(output_data, KERNEL_INFO_INDENT);
      print_comma = true;
    }

    fprintf(output_data, "\n");
    fprintf(output_data, "    ]\n");

    fprintf(output_data, "}\n}");
  }

  fclose(output_data);

  char currentwd[256];
  getcwd(currentwd, 256);
  printf("KokkosP: Kernel timing written to %s/%s \n", currentwd, fileOutput);

  /*printf("\n");
  printf("======================================================================\n");
  printf("KokkosP: Finalization of Profiling Library\n");
  printf("KokkosP: Executed a total of %llu kernels\n", uniqID);

  std::vector<KernelPerformanceInfo*> kernelList;

  for(auto kernel_itr = count_map.begin(); kernel_itr != count_map.end();
  kernel_itr++) { kernelList.push_back(kernel_itr->second); kernelTimes +=
  kernel_itr->second->getTime();
  }

  std::sort(kernelList.begin(), kernelList.end(), compareKernelPerformanceInfo);
  const double totalExecuteTime = (finishTime - initTime);

  if(0 == strcmp(outputDelimiter, " ")) {
          printf("KokkosP: %100s %14s %14s %6s %6s %14s %4s\n", "Kernel",
  "Calls", "s/Total", "\%/Ko", "\%/Tot", "s/Call", "Type"); } else {
          printf("KokkosP: %s%s%s%s%s%s%s%s%s%s%s%s%s\n",
                  "Kernel",
                  outputDelimiter,
                  "Calls",
                  outputDelimiter,
                  "s/Total",
                  outputDelimiter,
                  "\%/Ko",
                  outputDelimiter,
                  "\%/Tot",
                  outputDelimiter,
                  "s/Call",
                  outputDelimiter,
                  "Type");
  }

  for(auto kernel_itr = kernelList.begin(); kernel_itr != kernelList.end();
  kernel_itr++) { KernelPerformanceInfo* kernelInfo = *kernel_itr;

          const uint64_t kCallCount = kernelInfo->getCallCount();
          const double   kTime      = kernelInfo->getTime();
          const double   kTimeMean  = kTime / (double) kCallCount;

          const std::string& kName   = kernelInfo->getName();
          char* kType = const_cast<char*>("");

          switch(kernelInfo->getKernelType()) {
          case PARALLEL_FOR:
                  kType = const_cast<char*>("PFOR"); break;
          case PARALLEL_SCAN:
                  kType = const_cast<char*>("SCAN"); break;
          case PARALLEL_REDUCE:
                  kType = const_cast<char*>("RDCE"); break;
          case REGION
                  kType = const_cast<char*>("REGI"); break;
          }

          int demangleStatus;
          char* finalDemangle = abi::__cxa_demangle(kName.c_str(), 0, 0,
  &demangleStatus);

          if(0 == strcmp(outputDelimiter, " ")) {
                  printf("KokkosP:
  %s%s%14llu%s%14.5f%s%6.2f%s%6.2f%s%14.5f%s%4s\n", (0 == demangleStatus) ?
  finalDemangle : kName.c_str(), outputDelimiter, kCallCount, outputDelimiter,
                          kTime,
                          outputDelimiter,
                          (kTime / kernelTimes) * 100.0,
                          outputDelimiter,
                          (kTime / totalExecuteTime) * 100.0,
                          outputDelimiter,
                          kTimeMean,
                          outputDelimiter,
                          kType
                          );
          } else {
                  printf("KokkosP: %s%s%llu%s%f%s%f%s%f%s%f%s%s\n",
                          (0 == demangleStatus) ? finalDemangle : kName.c_str(),
                          outputDelimiter,
                          kCallCount,
                          outputDelimiter,
                          kTime,
                          outputDelimiter,
                          (kTime / kernelTimes) * 100.0,
                          outputDelimiter,
                          (kTime / totalExecuteTime) * 100.0,
                          outputDelimiter,
                          kTimeMean,
                          outputDelimiter,
                          kType
                          );
          }
  }

  printf("\n");
  printf("KokkosP: Total Execution Time:        %15.6f seconds.\n",
  totalExecuteTime); printf("KokkosP: Time in Kokkos Kernels:      %15.6f
  seconds.\n", kernelTimes); printf("KokkosP: Time spent outside Kokkos: %15.6f
  seconds.\n", (totalExecuteTime - kernelTimes));

  const double percentKokkos = (kernelTimes / totalExecuteTime) * 100.0;
  printf("KokkosP: Runtime in Kokkos Kernels:   %15.6f \%\n", percentKokkos);
  printf("KokkosP: Unique kernels:              %22llu \n", (uint64_t)
  count_map.size()); printf("KokkosP: Parallel For Calls:          %22llu \n",
  uniqID);

  printf("\n");
  printf("======================================================================\n");
  printf("\n");

  if(NULL != outputDelimiter) {
          free(outputDelimiter);
  }*/
}